

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char local_28 [16];
  
  builtin_strncpy(local_28,"1.5",4);
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,(this->NinjaVersion)._M_dataplus._M_p,local_28);
  this->NinjaSupportsConsolePool = !bVar1;
  builtin_strncpy(local_28,"1.7",4);
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,(this->NinjaVersion)._M_dataplus._M_p,local_28);
  this->NinjaSupportsImplicitOuts = !bVar1;
  if ((CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_), iVar2 != 0)) {
    CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p =
         (pointer)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-","");
    __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
  }
  lVar3 = std::__cxx11::string::find
                    ((char *)&this->NinjaVersion,
                     (ulong)CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_dataplus._M_p,0);
  if (lVar3 != -1) {
    cmSystemTools::StringToULong
              ((this->NinjaVersion)._M_dataplus._M_p +
               CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_string_length + lVar3,
               &this->NinjaSupportsDyndeps);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForConsolePool().c_str());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    this->RequiredNinjaVersionForImplicitOuts().c_str());
  {
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = this->NinjaVersion.c_str() + pos + k_DYNDEP_.size();
      cmSystemTools::StringToULong(fv, &this->NinjaSupportsDyndeps);
    }
  }
}